

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoRandomDataProvider.cc
# Opt level: O0

void __thiscall
CryptoRandomDataProvider::provideRandomData(CryptoRandomDataProvider *this,uchar *data,size_t len)

{
  element_type *peVar1;
  undefined1 local_30 [8];
  shared_ptr<QPDFCryptoImpl> crypto;
  size_t len_local;
  uchar *data_local;
  CryptoRandomDataProvider *this_local;
  
  crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)len;
  QPDFCryptoProvider::getImpl();
  peVar1 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  (*peVar1->_vptr_QPDFCryptoImpl[2])
            (peVar1,data,
             crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            );
  std::shared_ptr<QPDFCryptoImpl>::~shared_ptr((shared_ptr<QPDFCryptoImpl> *)local_30);
  return;
}

Assistant:

void
CryptoRandomDataProvider::provideRandomData(unsigned char* data, size_t len)
{
    auto crypto = QPDFCryptoProvider::getImpl();
    crypto->provideRandomData(data, len);
}